

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::ParseableFunctionInfo::ParseableFunctionInfo
          (ParseableFunctionInfo *this,JavascriptMethod entryPoint,int nestedCount,
          LocalFunctionId functionId,Utf8SourceInfo *sourceInfo,ScriptContext *scriptContext,
          uint functionNumber,char16 *displayName,uint displayNameLength,uint displayShortNameOffset
          ,Attributes attributes,FunctionBodyFlags flags)

{
  JavascriptMethod method;
  Recycler *pRVar1;
  FunctionInfo *this_00;
  NestedArray *this_01;
  FunctionEntryPointInfo *this_02;
  ThreadContext *context;
  ProxyEntryPointInfo *this_03;
  TrackAllocData local_120;
  code *local_f8;
  undefined8 local_f0;
  TrackAllocData local_e8;
  nullptr_t local_c0;
  code *local_b8;
  undefined8 local_b0;
  TrackAllocData local_a8;
  code *local_80;
  undefined8 local_78;
  TrackAllocData local_70;
  nullptr_t local_48;
  nullptr_t local_40;
  nullptr_t local_38;
  ScriptContext *local_30;
  ScriptContext *scriptContext_local;
  Utf8SourceInfo *sourceInfo_local;
  LocalFunctionId functionId_local;
  int nestedCount_local;
  JavascriptMethod entryPoint_local;
  ParseableFunctionInfo *this_local;
  
  local_30 = scriptContext;
  scriptContext_local = (ScriptContext *)sourceInfo;
  sourceInfo_local._0_4_ = functionId;
  sourceInfo_local._4_4_ = nestedCount;
  _functionId_local = entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  FunctionProxy::FunctionProxy(&this->super_FunctionProxy,scriptContext,sourceInfo,functionNumber);
  (this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01de0678;
  (this->super_FunctionProxy).field_0x45 = (this->super_FunctionProxy).field_0x45 | 1;
  (this->super_FunctionProxy).field_0x45 = (this->super_FunctionProxy).field_0x45 & 0xfd;
  (this->super_FunctionProxy).field_0x45 = (this->super_FunctionProxy).field_0x45 & 0xfb;
  (this->super_FunctionProxy).field_0x45 = (this->super_FunctionProxy).field_0x45 & 0xef;
  (this->super_FunctionProxy).field_0x45 = (this->super_FunctionProxy).field_0x45 & 0xdf;
  (this->super_FunctionProxy).field_0x45 = (this->super_FunctionProxy).field_0x45 | 0x40;
  (this->super_FunctionProxy).field_0x46 = (this->super_FunctionProxy).field_0x46 & 0xfe;
  (this->super_FunctionProxy).field_0x46 = (this->super_FunctionProxy).field_0x46 & 0xfd;
  (this->super_FunctionProxy).field_0x46 = (this->super_FunctionProxy).field_0x46 & 0xfb;
  (this->super_FunctionProxy).field_0x46 = (this->super_FunctionProxy).field_0x46 & 0xef;
  (this->super_FunctionProxy).field_0x46 = (this->super_FunctionProxy).field_0x46 | 0x20;
  (this->super_FunctionProxy).field_0x46 = (this->super_FunctionProxy).field_0x46 | 0x40;
  (this->super_FunctionProxy).field_0x46 = (this->super_FunctionProxy).field_0x46 & 0x7f;
  (this->super_FunctionProxy).field_0x47 = (this->super_FunctionProxy).field_0x47 & 0xfe;
  (this->super_FunctionProxy).field_0x47 = (this->super_FunctionProxy).field_0x47 & 0xfd;
  (this->super_FunctionProxy).field_0x47 = (this->super_FunctionProxy).field_0x47 | 4;
  (this->super_FunctionProxy).field_0x47 = (this->super_FunctionProxy).field_0x47 & 0xf7;
  (this->super_FunctionProxy).field_0x47 = (this->super_FunctionProxy).field_0x47 & 0xef;
  (this->super_FunctionProxy).field_0x47 = (this->super_FunctionProxy).field_0x47 & 0xdf;
  (this->super_FunctionProxy).field_0x47 = (this->super_FunctionProxy).field_0x47 & 0xbf;
  (this->super_FunctionProxy).field_0x47 = (this->super_FunctionProxy).field_0x47 & 0x7f;
  this->flags = flags;
  this->m_grfscr = 0;
  this->m_inParamCount = 0;
  this->m_reportedInParamCount = 0;
  this->m_cchStartOffset = 0;
  this->m_cchLength = 0;
  this->m_cbLength = 0;
  this->m_displayShortNameOffset = 0;
  this->scopeSlotArraySize = 0;
  this->paramScopeSlotArraySize = 0;
  this->m_sourceIndex = 0xffffffff;
  this->m_dynamicInterpreterThunk = (Type)0x0;
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::WriteBarrierPtr
            (&this->crossSiteDeferredFunctionType,&local_38);
  local_40 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::WriteBarrierPtr
            (&this->crossSiteUndeferredFunctionType,&local_40);
  this->m_cbStartOffset = 0;
  this->m_lineNumber = 0;
  this->m_columnNumber = 0;
  local_48 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierPtr(&this->m_displayName,&local_48);
  this->m_displayNameLength = 0;
  Memory::WriteBarrierPtr<Js::ParseableFunctionInfo::NestedArray>::WriteBarrierPtr
            (&this->nestedArray);
  this->scopeObjectSize = 0;
  pRVar1 = ScriptContext::GetRecycler(local_30);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_70,(type_info *)&FunctionInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x690);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_70);
  local_80 = Memory::Recycler::AllocInlined;
  local_78 = 0;
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar1,0x43c4b0);
  FunctionInfo::FunctionInfo
            (this_00,_functionId_local,attributes,(LocalFunctionId)sourceInfo_local,
             &this->super_FunctionProxy);
  Memory::WriteBarrierPtr<Js::FunctionInfo>::operator=
            (&(this->super_FunctionProxy).functionInfo,this_00);
  if ((int)sourceInfo_local._4_4_ < 1) {
    local_c0 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::ParseableFunctionInfo::NestedArray>::operator=
              (&this->nestedArray,&local_c0);
  }
  else {
    pRVar1 = ScriptContext::GetRecycler((this->super_FunctionProxy).m_scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_a8,(type_info *)&NestedArray::typeinfo,(long)(int)sourceInfo_local._4_4_ << 3,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x695);
    pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_a8);
    local_b8 = Memory::Recycler::AllocZero;
    local_b0 = 0;
    this_01 = (NestedArray *)new<Memory::Recycler>(8,pRVar1,0x473830,0);
    NestedArray::NestedArray(this_01,sourceInfo_local._4_4_);
    Memory::WriteBarrierPtr<Js::ParseableFunctionInfo::NestedArray>::operator=
              (&this->nestedArray,this_01);
  }
  if ((attributes & DeferredParse) == None) {
    pRVar1 = ScriptContext::GetRecycler(local_30);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_e8,(type_info *)&FunctionEntryPointInfo::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x69f);
    pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_e8);
    local_f8 = Memory::Recycler::AllocFinalizedInlined;
    local_f0 = 0;
    this_02 = (FunctionEntryPointInfo *)new<Memory::Recycler>(0x88,pRVar1,0x4642b0);
    method = _functionId_local;
    context = ScriptContext::GetThreadContext(local_30);
    FunctionEntryPointInfo::FunctionEntryPointInfo
              (this_02,&this->super_FunctionProxy,method,context);
    Memory::WriteBarrierPtr<Js::ProxyEntryPointInfo>::operator=
              (&(this->super_FunctionProxy).m_defaultEntryPointInfo,(ProxyEntryPointInfo *)this_02);
  }
  else {
    pRVar1 = ScriptContext::GetRecycler(local_30);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_120,(type_info *)&ProxyEntryPointInfo::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x6a3);
    pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_120);
    this_03 = (ProxyEntryPointInfo *)new<Memory::Recycler>(0x18,pRVar1,0x43c4b0);
    ProxyEntryPointInfo::ProxyEntryPointInfo(this_03,_functionId_local,(ThreadContext *)0x0);
    Memory::WriteBarrierPtr<Js::ProxyEntryPointInfo>::operator=
              (&(this->super_FunctionProxy).m_defaultEntryPointInfo,this_03);
  }
  (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[6])
            (this,displayName,(ulong)displayNameLength,(ulong)displayShortNameOffset,0);
  FunctionProxy::SetOriginalEntryPoint
            (&this->super_FunctionProxy,InterpreterStackFrame::DelayDynamicInterpreterThunk);
  return;
}

Assistant:

ParseableFunctionInfo::ParseableFunctionInfo(JavascriptMethod entryPoint, int nestedCount,
        LocalFunctionId functionId, Utf8SourceInfo* sourceInfo, ScriptContext* scriptContext, uint functionNumber,
        const char16* displayName, uint displayNameLength, uint displayShortNameOffset, FunctionInfo::Attributes attributes, FunctionBodyFlags flags) :
      FunctionProxy(scriptContext, sourceInfo, functionNumber),
      crossSiteDeferredFunctionType(nullptr),
      crossSiteUndeferredFunctionType(nullptr),
#if DYNAMIC_INTERPRETER_THUNK
      m_dynamicInterpreterThunk(nullptr),
#endif
      flags(flags),
      m_hasBeenParsed(false),
      m_isGlobalFunc(false),
      m_isDeclaration(false),
      m_isNamedFunctionExpression(false),
      m_isNameIdentifierRef (true),
      m_isStaticNameFunction(false),
      m_doBackendArgumentsOptimization(true),
      m_doScopeObjectCreation(true),
      m_usesArgumentsObject(false),
      m_isStrictMode(false),
      m_isAsmjsMode(false),
      m_dontInline(false),
      m_hasImplicitArgIns(true),
      m_grfscr(0),
      m_inParamCount(0),
      m_reportedInParamCount(0),
      m_sourceIndex(Js::Constants::InvalidSourceIndex),
      m_utf8SourceHasBeenSet(false),
      m_cchLength(0),
      m_cbLength(0),
      m_cchStartOffset(0),
      m_cbStartOffset(0),
      m_lineNumber(0),
      m_columnNumber(0),
      m_isEval(false),
      m_isDynamicFunction(false),
      m_displayName(nullptr),
      m_displayNameLength(0),
      m_displayShortNameOffset(0),
      scopeSlotArraySize(0),
      paramScopeSlotArraySize(0),
      m_reparsed(false),
      m_isAsmJsFunction(false),
      m_tag21(true),
      m_isMethod(false)
#if DBG
      ,m_wasEverAsmjsMode(false)
      ,scopeObjectSize(0)
#endif
    {
        this->functionInfo = RecyclerNew(scriptContext->GetRecycler(), FunctionInfo, entryPoint, attributes, functionId, this);

        if (nestedCount > 0)
        {
            nestedArray = RecyclerNewPlusZ(m_scriptContext->GetRecycler(),
                nestedCount*sizeof(FunctionProxy*), NestedArray, nestedCount);
        }
        else
        {
            nestedArray = nullptr;
        }

        if ((attributes & Js::FunctionInfo::DeferredParse) == 0)
        {
            this->m_defaultEntryPointInfo = RecyclerNewFinalized(scriptContext->GetRecycler(),
                FunctionEntryPointInfo, this, entryPoint, scriptContext->GetThreadContext());
        }
        else
        {
            this->m_defaultEntryPointInfo = RecyclerNew(scriptContext->GetRecycler(), ProxyEntryPointInfo, entryPoint);
        }

        SetDisplayName(displayName, displayNameLength, displayShortNameOffset);
        this->SetOriginalEntryPoint(DefaultEntryThunk);
    }